

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O1

bool llvm::ConvertUTF8toWide(StringRef Source,wstring *Result)

{
  bool bVar1;
  UTF8 **in_R9;
  StringRef Source_00;
  char *ResultPtr;
  UTF8 *ErrorPtr;
  pointer local_30;
  char *local_28;
  
  std::__cxx11::wstring::resize((ulong)Result,(int)Source.Length + L'\x01');
  local_30 = (Result->_M_dataplus)._M_p;
  Source_00.Length = (size_t)&local_30;
  Source_00.Data = (char *)Source.Length;
  bVar1 = ConvertUTF8toWide((llvm *)0x4,(uint)Source.Data,Source_00,&local_28,in_R9);
  if (bVar1) {
    std::__cxx11::wstring::resize
              ((ulong)Result,(wchar_t)((long)local_30 - (long)(Result->_M_dataplus)._M_p >> 2));
  }
  else {
    Result->_M_string_length = 0;
    *(Result->_M_dataplus)._M_p = L'\0';
  }
  return bVar1;
}

Assistant:

bool ConvertUTF8toWide(llvm::StringRef Source, std::wstring &Result) {
  return ConvertUTF8toWideInternal(Source, Result);
}